

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)5>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint *end;
  uint *b;
  uint uVar18;
  long lVar19;
  long in_FS_OFFSET;
  ulong uVar20;
  uint *puVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  uint uVar26;
  uint uVar28;
  double dVar27;
  uint uVar29;
  int iVar30;
  uint local_88;
  uint local_40;
  uint local_3c;
  long local_38;
  
  uVar20 = (ulong)(uint)y;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar21 = (uint *)((double)x + 0.5);
  dVar24 = (double)y + 0.5;
  end = buffer + length;
  bVar6 = canUseFastMatrixPath((qreal)puVar21,dVar24,(long)length,data);
  if (bVar6) {
    dVar1 = data->m11;
    dVar25 = data->m22;
    uVar29 = (uint)(dVar1 * 65536.0);
    iVar30 = (int)(data->m12 * 65536.0);
    uVar26 = (int)((dVar24 * data->m21 + (double)puVar21 * dVar1 + data->dx) * 65536.0) - 0x8000;
    uVar28 = (int)((dVar24 * dVar25 + (double)puVar21 * data->m12 + data->dy) * 65536.0) - 0x8000;
    local_40 = uVar28;
    local_3c = uVar26;
    if (iVar30 == 0) {
      uVar9 = -uVar29;
      if (0 < (int)uVar29) {
        uVar9 = uVar29;
      }
      b = buffer;
      if (0x10000 < uVar9) {
        if (0x20000 < uVar9) {
          local_88 = uVar28 >> 8 & 0xff;
          uVar9 = (data->field_23).texture.height;
          iVar30 = ((int)uVar28 >> 0x10) % (int)uVar9;
          uVar20 = -(ulong)(dVar25 < -dVar25);
          uVar12 = iVar30 >> 0x1f & uVar9;
          uVar28 = uVar12 + iVar30 + 1;
          if (uVar28 == uVar9) {
            uVar28 = 0;
          }
          puVar2 = (data->field_23).texture.imageData;
          lVar19 = (data->field_23).texture.bytesPerLine;
          lVar13 = (int)(uVar12 + iVar30) * lVar19;
          lVar19 = (int)uVar28 * lVar19;
          puVar21 = buffer;
          if (0.125 <= (double)(~uVar20 & (ulong)dVar25 | (ulong)-dVar25 & uVar20)) {
            for (; local_3c = uVar26, puVar21 < end; puVar21 = puVar21 + 1) {
              uVar28 = (data->field_23).texture.width;
              iVar30 = (int)(CONCAT44((int)uVar26 >> 0x1f,(int)uVar26 >> 0x10) % (long)(int)uVar28);
              uVar12 = iVar30 >> 0x1f & uVar28;
              uVar9 = uVar12 + iVar30 + 1;
              if (uVar9 == uVar28) {
                uVar9 = 0;
              }
              lVar14 = (long)(int)(uVar12 + iVar30);
              uVar11 = interpolate_4_pixels
                                 (*(uint *)(puVar2 + lVar14 * 4 + lVar13),
                                  *(uint *)(puVar2 + (long)(int)uVar9 * 4 + lVar13),
                                  *(uint *)(puVar2 + lVar14 * 4 + lVar19),
                                  *(uint *)(puVar2 + (long)(int)uVar9 * 4 + lVar19),
                                  uVar26 >> 8 & 0xff,local_88);
              *puVar21 = uVar11;
              uVar26 = uVar26 + uVar29;
            }
          }
          else {
            for (; local_3c = uVar26, puVar21 < end; puVar21 = puVar21 + 1) {
              uVar28 = (data->field_23).texture.width;
              iVar30 = (int)(CONCAT44((int)uVar26 >> 0x1f,(int)uVar26 >> 0x10) % (long)(int)uVar28);
              uVar12 = iVar30 >> 0x1f & uVar28;
              uVar9 = uVar12 + iVar30 + 1;
              if (uVar9 == uVar28) {
                uVar9 = 0;
              }
              lVar14 = (long)(int)(uVar12 + iVar30);
              uVar11 = interpolate_4_pixels
                                 (*(uint *)(puVar2 + lVar14 * 4 + lVar13),
                                  *(uint *)(puVar2 + (long)(int)uVar9 * 4 + lVar13),
                                  *(uint *)(puVar2 + lVar14 * 4 + lVar19),
                                  *(uint *)(puVar2 + (long)(int)uVar9 * 4 + lVar19),
                                  uVar26 >> 8 & 0xff,local_88);
              *puVar21 = uVar11;
              uVar26 = uVar26 + uVar29;
            }
          }
          goto LAB_005acf93;
        }
        uVar26 = length + 1U >> 1;
        if (length < 0x400) {
          uVar26 = length;
        }
        fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                  (buffer,buffer + (int)uVar26,&(data->field_23).texture,(int *)&local_3c,
                   (int *)&local_40,uVar29,(int)end);
        b = buffer + (int)uVar26;
        puVar21 = end;
        if (uVar26 == length) goto LAB_005acf93;
      }
      fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                (b,end,&(data->field_23).texture,(int *)&local_3c,(int *)&local_40,uVar29,
                 (int)puVar21);
    }
    else {
      uVar20 = -(ulong)(dVar1 < -dVar1);
      if (((double)(~uVar20 & (ulong)dVar1 | (ulong)-dVar1 & uVar20) < 0.125) ||
         (uVar20 = -(ulong)(dVar25 < -dVar25),
         (double)(~uVar20 & (ulong)dVar25 | (ulong)-dVar25 & uVar20) < 0.125)) {
        puVar2 = (data->field_23).texture.imageData;
        lVar19 = (data->field_23).texture.bytesPerLine;
        for (puVar21 = buffer; puVar21 < end; puVar21 = puVar21 + 1) {
          uVar9 = (data->field_23).texture.width;
          uVar12 = (data->field_23).texture.height;
          iVar7 = ((int)uVar26 >> 0x10) % (int)uVar9;
          uVar8 = iVar7 >> 0x1f & uVar9;
          uVar18 = uVar8 + iVar7 + 1;
          if (uVar18 == uVar9) {
            uVar18 = 0;
          }
          iVar15 = ((int)uVar28 >> 0x10) % (int)uVar12;
          uVar9 = iVar15 >> 0x1f & uVar12;
          uVar10 = uVar9 + iVar15 + 1;
          if (uVar10 == uVar12) {
            uVar10 = 0;
          }
          lVar14 = (int)(uVar9 + iVar15) * lVar19;
          lVar13 = (int)uVar10 * lVar19;
          lVar17 = (long)(int)(uVar8 + iVar7);
          uVar11 = interpolate_4_pixels
                             (*(uint *)(puVar2 + lVar17 * 4 + lVar14),
                              *(uint *)(puVar2 + (long)(int)uVar18 * 4 + lVar14),
                              *(uint *)(puVar2 + lVar17 * 4 + lVar13),
                              *(uint *)(puVar2 + (long)(int)uVar18 * 4 + lVar13),uVar26 >> 8 & 0xff,
                              uVar28 >> 8 & 0xff);
          *puVar21 = uVar11;
          uVar26 = uVar26 + uVar29;
          uVar28 = uVar28 + iVar30;
        }
      }
      else {
        puVar2 = (data->field_23).texture.imageData;
        lVar19 = (data->field_23).texture.bytesPerLine;
        for (puVar21 = buffer; puVar21 < end; puVar21 = puVar21 + 1) {
          uVar9 = (data->field_23).texture.width;
          uVar12 = (data->field_23).texture.height;
          iVar7 = ((int)uVar26 >> 0x10) % (int)uVar9;
          uVar8 = iVar7 >> 0x1f & uVar9;
          uVar18 = uVar8 + iVar7 + 1;
          if (uVar18 == uVar9) {
            uVar18 = 0;
          }
          iVar15 = ((int)uVar28 >> 0x10) % (int)uVar12;
          uVar9 = iVar15 >> 0x1f & uVar12;
          uVar10 = uVar9 + iVar15 + 1;
          if (uVar10 == uVar12) {
            uVar10 = 0;
          }
          lVar14 = (int)(uVar9 + iVar15) * lVar19;
          lVar13 = (int)uVar10 * lVar19;
          lVar17 = (long)(int)(uVar8 + iVar7);
          uVar11 = interpolate_4_pixels
                             (*(uint *)(puVar2 + lVar17 * 4 + lVar14),
                              *(uint *)(puVar2 + (long)(int)uVar18 * 4 + lVar14),
                              *(uint *)(puVar2 + lVar17 * 4 + lVar13),
                              *(uint *)(puVar2 + (long)(int)uVar18 * 4 + lVar13),uVar26 >> 8 & 0xff,
                              uVar28 >> 8 & 0xff);
          *puVar21 = uVar11;
          uVar26 = uVar26 + uVar29;
          uVar28 = uVar28 + iVar30;
        }
      }
    }
  }
  else {
    dVar1 = data->m13;
    dVar4 = data->m11;
    dVar5 = data->m12;
    dVar25 = dVar24 * data->m23 + (double)puVar21 * dVar1 + data->m33;
    dVar27 = data->dx + dVar24 * data->m21 + (double)puVar21 * dVar4;
    dVar24 = data->dy + dVar24 * data->m22 + (double)puVar21 * dVar5;
    for (puVar21 = buffer; puVar21 < end; puVar21 = puVar21 + 1) {
      dVar23 = (double)(-(ulong)(dVar25 == 0.0) & 0x3ff0000000000000 |
                       ~-(ulong)(dVar25 == 0.0) & (ulong)(1.0 / dVar25));
      dVar22 = dVar23 * dVar27 + -0.5;
      dVar23 = dVar23 * dVar24 + -0.5;
      auVar3._8_8_ = -(ulong)(dVar23 < 0.0);
      auVar3._0_8_ = -(ulong)(dVar22 < 0.0);
      uVar26 = movmskpd((int)uVar20,auVar3);
      iVar30 = (int)dVar22 - (uVar26 & 1);
      iVar15 = (int)dVar23 - (uVar26 >> 1 & 0x7f);
      uVar26 = (data->field_23).texture.width;
      iVar7 = iVar30 % (int)uVar26;
      uVar28 = iVar7 >> 0x1f & uVar26;
      uVar29 = uVar28 + iVar7 + 1;
      if (uVar29 == uVar26) {
        uVar29 = 0;
      }
      uVar26 = (data->field_23).texture.height;
      iVar16 = iVar15 % (int)uVar26;
      uVar9 = iVar16 >> 0x1f & uVar26;
      uVar12 = uVar9 + iVar16 + 1;
      if (uVar12 == uVar26) {
        uVar12 = 0;
      }
      puVar2 = (data->field_23).texture.imageData;
      lVar19 = (data->field_23).texture.bytesPerLine;
      lVar13 = (int)(uVar9 + iVar16) * lVar19;
      lVar19 = (int)uVar12 * lVar19;
      lVar14 = (long)(int)(uVar28 + iVar7);
      uVar20 = (ulong)*(uint *)(puVar2 + (long)(int)uVar29 * 4 + lVar19);
      uVar11 = interpolate_4_pixels
                         (*(uint *)(puVar2 + lVar14 * 4 + lVar13),
                          *(uint *)(puVar2 + (long)(int)uVar29 * 4 + lVar13),
                          *(uint *)(puVar2 + lVar14 * 4 + lVar19),
                          *(uint *)(puVar2 + (long)(int)uVar29 * 4 + lVar19),
                          (int)((dVar22 - (double)iVar30) * 256.0),
                          (int)((dVar23 - (double)iVar15) * 256.0));
      *puVar21 = uVar11;
      dVar27 = dVar27 + dVar4;
      dVar24 = dVar24 + dVar5;
      dVar25 = dVar25 + dVar1;
      dVar25 = (double)((ulong)dVar25 & -(ulong)(dVar25 != 0.0) |
                       ~-(ulong)(dVar25 != 0.0) & (ulong)(dVar1 + dVar25));
    }
  }
LAB_005acf93:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}